

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall wasm::OptimizeInstructions::visitRefEq(OptimizeInstructions *this,RefEq *curr)

{
  Expression **input;
  Expression **input_00;
  Expression *pEVar1;
  bool bVar2;
  bool bVar3;
  Expression *__tmp;
  HeapType left;
  HeapType right;
  Expression *pEVar4;
  Expression *pEVar5;
  RefIsNull *rep;
  Literal *this_00;
  Literal local_80;
  Type local_68;
  Type nullableEq;
  Builder local_48;
  Type local_40;
  Type leftType;
  Type rightType;
  
  local_40.id = (curr->left->type).id;
  leftType.id = (curr->right->type).id;
  if (leftType.id != 1 && local_40.id != 1) {
    left = wasm::Type::getHeapType(&local_40);
    right = wasm::Type::getHeapType(&leftType);
    bVar2 = HeapType::isSubType(left,right);
    bVar3 = HeapType::isSubType(right,left);
    if (((bVar2) || (bVar3)) ||
       ((bVar2 = wasm::Type::isNonNullable(&local_40), !bVar2 &&
        (bVar2 = wasm::Type::isNonNullable(&leftType), !bVar2)))) {
      input = &curr->left;
      input_00 = &curr->right;
      wasm::Type::Type(&local_68,(HeapType)0x3,Nullable);
      skipCast(this,input,local_68);
      skipCast(this,input_00,local_68);
      bVar2 = areConsecutiveInputsEqualAndFoldable(this,*input,*input_00);
      if (!bVar2) {
        pEVar4 = *input;
        pEVar1 = *input_00;
        pEVar5 = pEVar1;
        if (pEVar4->_id == RefNullId) {
          *input = pEVar1;
          *input_00 = pEVar4;
          pEVar5 = pEVar4;
          pEVar4 = pEVar1;
        }
        if (pEVar5->_id != RefNullId) {
          return;
        }
        local_48.wasm =
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
        rep = Builder::makeRefIsNull(&local_48,pEVar4);
        replaceCurrent(this,(Expression *)rep);
        return;
      }
      Literal::makeOne((Literal *)&nullableEq,(Type)0x2);
      pEVar4 = getDroppedChildrenAndAppend(this,(Expression *)curr,(Literal *)&nullableEq);
      replaceCurrent(this,pEVar4);
      this_00 = (Literal *)&nullableEq;
    }
    else {
      Literal::makeZero(&local_80,(Type)0x2);
      pEVar4 = getDroppedChildrenAndAppend(this,(Expression *)curr,&local_80);
      replaceCurrent(this,pEVar4);
      this_00 = &local_80;
    }
    Literal::~Literal(this_00);
  }
  return;
}

Assistant:

void visitRefEq(RefEq* curr) {
    // The types may prove that the same reference cannot appear on both sides.
    auto leftType = curr->left->type;
    auto rightType = curr->right->type;
    if (leftType == Type::unreachable || rightType == Type::unreachable) {
      // Leave this for DCE.
      return;
    }
    auto leftHeapType = leftType.getHeapType();
    auto rightHeapType = rightType.getHeapType();
    auto leftIsHeapSubtype = HeapType::isSubType(leftHeapType, rightHeapType);
    auto rightIsHeapSubtype = HeapType::isSubType(rightHeapType, leftHeapType);
    if (!leftIsHeapSubtype && !rightIsHeapSubtype &&
        (leftType.isNonNullable() || rightType.isNonNullable())) {
      // The heap types have no intersection, so the only thing that can
      // possibly appear on both sides is null, but one of the two is non-
      // nullable, which rules that out. So there is no way that the same
      // reference can appear on both sides.
      replaceCurrent(
        getDroppedChildrenAndAppend(curr, Literal::makeZero(Type::i32)));
      return;
    }

    // Equality does not depend on the type, so casts may be removable.
    //
    // This is safe to do first because nothing farther down cares about the
    // type, and we consume the two input references, so removing a cast could
    // not help our parents (see "notes on removing casts").
    Type nullableEq = Type(HeapType::eq, Nullable);
    skipCast(curr->left, nullableEq);
    skipCast(curr->right, nullableEq);

    // Identical references compare equal.
    // (Technically we do not need to check if the inputs are also foldable into
    // a single one, but we do not have utility code to handle non-foldable
    // cases yet; the foldable case we do handle is the common one of the first
    // child being a tee and the second a get of that tee. TODO)
    if (areConsecutiveInputsEqualAndFoldable(curr->left, curr->right)) {
      replaceCurrent(
        getDroppedChildrenAndAppend(curr, Literal::makeOne(Type::i32)));
      return;
    }

    // Canonicalize to the pattern of a null on the right-hand side, if there is
    // one. This makes pattern matching simpler.
    if (curr->left->is<RefNull>()) {
      std::swap(curr->left, curr->right);
    }

    // RefEq of a value to Null can be replaced with RefIsNull.
    if (curr->right->is<RefNull>()) {
      replaceCurrent(Builder(*getModule()).makeRefIsNull(curr->left));
    }
  }